

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void var_new(LexState *ls,BCReg n,GCstr *name)

{
  uint uVar1;
  FuncState *fs;
  
  fs = ls->fs;
  if (fs->nactvar + n < 200) {
    uVar1 = ls->vtop;
    if (ls->sizevstack <= uVar1) {
      var_new_cold_1();
    }
    ls->vstack[uVar1].name.gcptr32 = (uint32_t)name;
    fs->varmap[n + fs->nactvar] = (VarIndex)uVar1;
    ls->vtop = uVar1 + 1;
    return;
  }
  err_limit(fs,200,"local variables");
}

Assistant:

static void var_new(LexState *ls, BCReg n, GCstr *name)
{
  FuncState *fs = ls->fs;
  MSize vtop = ls->vtop;
  checklimit(fs, fs->nactvar+n, LJ_MAX_LOCVAR, "local variables");
  if (LJ_UNLIKELY(vtop >= ls->sizevstack)) {
    if (ls->sizevstack >= LJ_MAX_VSTACK)
      lj_lex_error(ls, 0, LJ_ERR_XLIMC, LJ_MAX_VSTACK);
    lj_mem_growvec(ls->L, ls->vstack, ls->sizevstack, LJ_MAX_VSTACK, VarInfo);
  }
  lua_assert((uintptr_t)name < VARNAME__MAX ||
	     lj_tab_getstr(fs->kt, name) != NULL);
  /* NOBARRIER: name is anchored in fs->kt and ls->vstack is not a GCobj. */
  setgcref(ls->vstack[vtop].name, obj2gco(name));
  fs->varmap[fs->nactvar+n] = (uint16_t)vtop;
  ls->vtop = vtop+1;
}